

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool cmProjectCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  cmValue name;
  cmMakefile *pcVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  size_type sVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  reference pvVar9;
  ulong uVar10;
  reference pvVar11;
  char *value;
  undefined1 auVar12 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11b0;
  bool local_f79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  allocator<char> local_e59;
  string local_e58;
  undefined1 local_e33;
  allocator<char> local_e32;
  allocator<char> local_e31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  string local_e08 [32];
  iterator local_de8;
  size_type local_de0;
  allocator<char> local_dd1;
  string local_dd0;
  string_view local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  string_view local_d80;
  allocator<char> local_d69;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  string_view local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  string_view local_cf0;
  allocator<char> local_cd9;
  string local_cd8;
  cmAlphaNum local_cb8;
  string local_c88;
  cmAlphaNum local_c68;
  string local_c38;
  string_view local_c18;
  string *local_c08;
  string *local_c00;
  cmValue v_1;
  string *i_3;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string vw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  iterator local_a68;
  size_type local_a60;
  undefined1 local_a58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv_1;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  string_view local_978;
  string_view local_968;
  allocator<char> local_951;
  string local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string_view local_910;
  string_view local_900;
  allocator<char> local_8e9;
  string local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  string_view local_8a8;
  string_view local_898;
  allocator<char> local_881;
  string local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  string_view local_840;
  string_view local_830;
  allocator<char> local_819;
  string local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  string_view local_7d8;
  string_view local_7c8;
  allocator<char> local_7b1;
  string local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [8];
  string vv;
  undefined1 local_748 [4];
  uint i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  uint i_1;
  int vc;
  uint v [4];
  char vb [4] [11];
  size_t maxIntLength;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  version_components;
  string version_string;
  size_t MAX_VERSION_COMPONENTS;
  undefined1 local_628 [4];
  PolicyStatus cmp0096;
  undefined1 local_608 [8];
  string e;
  RegularExpression vx;
  string local_510;
  PolicyStatus local_4f0;
  allocator<char> local_4e9;
  PolicyStatus cmp0048;
  anon_class_16_2_1685bbe2 local_4c8;
  allocator<char> local_4b1;
  string local_4b0;
  anon_class_16_2_1685bbe2 local_490;
  allocator<char> local_479;
  string local_478;
  anon_class_16_2_1685bbe2 local_458;
  allocator<char> local_441;
  string local_440;
  char local_419;
  string_view local_418;
  string_view local_408;
  string local_3f8;
  cmAlphaNum local_3d8;
  cmAlphaNum local_3a8;
  undefined1 local_378 [8];
  string msg;
  string local_350;
  ulong local_330;
  size_t i;
  anon_class_8_1_0e9793f7 aStack_320;
  Doing doing;
  anon_class_8_1_0e9793f7 resetReporter;
  function<void_()> missedValueReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string homepage;
  string description;
  string version;
  undefined1 local_278 [2];
  bool injectedProjectCommand;
  bool haveHomepage;
  bool haveDescription;
  bool haveLanguages;
  bool haveVersion;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  cmValue local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string_view local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  string_view local_180;
  allocator<char> local_169;
  string local_168;
  string_view local_148;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  const_reference local_90;
  string *projectName;
  string local_80;
  cmMakefile *local_60;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar2 = local_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"PROJECT called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00347d73;
  }
  local_60 = cmExecutionStatus::GetMakefile(local_20);
  pcVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_PROJECT_INCLUDE_BEFORE",
             (allocator<char> *)((long)&projectName + 7));
  bVar3 = IncludeByVariable(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&projectName + 7));
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    args_local._7_1_ = 0;
    goto LAB_00347d73;
  }
  local_90 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
  pcVar2 = local_20;
  std::operator+(&local_d0,"CMAKE_PROJECT_",local_90);
  std::operator+(&local_b0,&local_d0,"_INCLUDE_BEFORE");
  bVar3 = IncludeByVariable(pcVar2,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    args_local._7_1_ = 0;
    goto LAB_00347d73;
  }
  cmMakefile::SetProjectName(local_60,local_90);
  pcVar1 = local_60;
  std::operator+(&local_f0,local_90,"_BINARY_DIR");
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_60);
  cmMakefile::AddCacheDefinition(pcVar1,&local_f0,psVar5,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&local_f0);
  pcVar1 = local_60;
  std::operator+(&local_110,local_90,"_SOURCE_DIR");
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_60);
  cmMakefile::AddCacheDefinition(pcVar1,&local_110,psVar5,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&local_110);
  pcVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"PROJECT_BINARY_DIR",&local_131);
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_60);
  local_148 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  cmMakefile::AddDefinition(pcVar1,&local_130,local_148);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pcVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"PROJECT_SOURCE_DIR",&local_169);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_60);
  local_180 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  cmMakefile::AddDefinition(pcVar1,&local_168,local_180);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  pcVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"PROJECT_NAME",&local_1a1)
  ;
  local_1b8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
  cmMakefile::AddDefinition(pcVar1,&local_1a0,local_1b8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pcVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"PROJECT_IS_TOP_LEVEL",&local_1d9);
  bVar3 = cmMakefile::IsRootMakefile(local_60);
  cmMakefile::AddDefinitionBool(pcVar1,&local_1d8,bVar3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pcVar1 = local_60;
  std::operator+(&local_200,local_90,"_IS_TOP_LEVEL");
  bVar3 = cmMakefile::IsRootMakefile(local_60);
  value = "OFF";
  if (bVar3) {
    value = "ON";
  }
  cmMakefile::AddCacheDefinition(pcVar1,&local_200,value,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&local_200);
  pcVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"CMAKE_PROJECT_NAME",&local_229);
  local_208 = cmMakefile::GetDefinition(pcVar1,&local_228);
  bVar3 = cmValue::operator_cast_to_bool(&local_208);
  local_f79 = true;
  if (bVar3) {
    local_f79 = cmMakefile::IsRootMakefile(local_60);
  }
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  pcVar1 = local_60;
  if (local_f79 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"CMAKE_PROJECT_NAME",&local_251);
    cmMakefile::RemoveDefinition(pcVar1,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    pcVar1 = local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"CMAKE_PROJECT_NAME",
               (allocator<char> *)(version.field_2._M_local_buf + 0xf));
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_278,local_90,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)local_278);
    std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
  }
  version.field_2._M_local_buf[0xe] = '\0';
  version.field_2._M_local_buf[0xd] = '\0';
  version.field_2._M_local_buf[0xc] = '\0';
  version.field_2._M_local_buf[0xb] = '\0';
  version.field_2._M_local_buf[10] = '\0';
  std::__cxx11::string::string((string *)(description.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&missedValueReporter._M_invoker);
  std::function<void_()>::function((function<void_()> *)&resetReporter);
  aStack_320.missedValueReporter = (function<void_()> *)&resetReporter;
  i._4_4_ = 2;
  local_330 = 1;
  while( true ) {
    uVar10 = local_330;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar6 <= uVar10) break;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,local_330);
    bVar3 = std::operator==(pvVar7,"LANGUAGES");
    pcVar1 = local_60;
    if (bVar3) {
      if ((version.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"LANGUAGES may be specified at most once.",
                   (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        goto LAB_00347cf7;
      }
      version.field_2._M_local_buf[0xd] = '\x01';
      bVar3 = std::function::operator_cast_to_bool((function *)&resetReporter);
      if (bVar3) {
        std::function<void_()>::operator()((function<void_()> *)&resetReporter);
      }
      i._4_4_ = 2;
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (!bVar3) {
        cmAlphaNum::cmAlphaNum
                  (&local_3a8,"the following parameters must be specified after LANGUAGES keyword: "
                  );
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,", ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_418);
        cmJoin(&local_3f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&missedValueReporter._M_invoker,local_408,local_418);
        cmAlphaNum::cmAlphaNum(&local_3d8,&local_3f8);
        local_419 = '.';
        cmStrCat<char>((string *)local_378,&local_3a8,&local_3d8,&local_419);
        std::__cxx11::string::~string((string *)&local_3f8);
        cmMakefile::IssueMessage(local_60,WARNING,(string *)local_378);
        std::__cxx11::string::~string((string *)local_378);
      }
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,local_330);
      bVar3 = std::operator==(pvVar7,"VERSION");
      pcVar1 = local_60;
      if (bVar3) {
        if ((version.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,"VERSION may be specified at most once.",&local_441);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::allocator<char>::~allocator(&local_441);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 1;
          msg.field_2._8_4_ = 1;
          goto LAB_00347cf7;
        }
        version.field_2._M_local_buf[0xe] = '\x01';
        bVar3 = std::function::operator_cast_to_bool((function *)&resetReporter);
        if (bVar3) {
          std::function<void_()>::operator()((function<void_()> *)&resetReporter);
        }
        i._4_4_ = 3;
        local_458.mf = local_60;
        local_458.resetReporter = &stack0xfffffffffffffce0;
        std::function<void()>::operator=((function<void()> *)&resetReporter,&local_458);
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,local_330);
        bVar3 = std::operator==(pvVar7,"DESCRIPTION");
        pcVar1 = local_60;
        if (bVar3) {
          if ((version.field_2._M_local_buf[0xc] & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,"DESCRIPTION may be specified at most once.",&local_479)
            ;
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator(&local_479);
            cmSystemTools::SetFatalErrorOccurred();
            args_local._7_1_ = 1;
            msg.field_2._8_4_ = 1;
            goto LAB_00347cf7;
          }
          version.field_2._M_local_buf[0xc] = '\x01';
          bVar3 = std::function::operator_cast_to_bool((function *)&resetReporter);
          if (bVar3) {
            std::function<void_()>::operator()((function<void_()> *)&resetReporter);
          }
          i._4_4_ = 0;
          local_490.mf = local_60;
          local_490.resetReporter = &stack0xfffffffffffffce0;
          std::function<void()>::operator=((function<void()> *)&resetReporter,&local_490);
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,local_330);
          bVar3 = std::operator==(pvVar7,"HOMEPAGE_URL");
          pcVar1 = local_60;
          if (bVar3) {
            if ((version.field_2._M_local_buf[0xb] & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b0,"HOMEPAGE_URL may be specified at most once.",
                         &local_4b1);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_4b0);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::allocator<char>::~allocator(&local_4b1);
              cmSystemTools::SetFatalErrorOccurred();
              args_local._7_1_ = 1;
              msg.field_2._8_4_ = 1;
              goto LAB_00347cf7;
            }
            version.field_2._M_local_buf[0xb] = '\x01';
            i._4_4_ = 1;
            local_4c8.mf = local_60;
            local_4c8.resetReporter = &stack0xfffffffffffffce0;
            std::function<void()>::operator=((function<void()> *)&resetReporter,&local_4c8);
          }
          else {
            if (local_330 == 1) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,1);
              bVar3 = std::operator==(pvVar7,"__CMAKE_INJECTED_PROJECT_COMMAND__");
              if (bVar3) {
                version.field_2._M_local_buf[10] = '\x01';
                goto LAB_00345c64;
              }
            }
            if (i._4_4_ == 3) {
              i._4_4_ = 2;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,local_330);
              std::__cxx11::string::operator=
                        ((string *)(description.field_2._M_local_buf + 8),(string *)pvVar7);
              cmProjectCommand::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffce0);
            }
            else if (i._4_4_ == 0) {
              i._4_4_ = 2;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,local_330);
              std::__cxx11::string::operator=
                        ((string *)(homepage.field_2._M_local_buf + 8),(string *)pvVar7);
              cmProjectCommand::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffce0);
            }
            else if (i._4_4_ == 1) {
              i._4_4_ = 2;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,local_330);
              std::__cxx11::string::operator=
                        ((string *)
                         &languages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar7);
              cmProjectCommand::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffce0);
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,local_330);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&missedValueReporter._M_invoker,pvVar7);
            }
          }
        }
      }
    }
LAB_00345c64:
    local_330 = local_330 + 1;
  }
  bVar3 = std::function::operator_cast_to_bool((function *)&resetReporter);
  if (bVar3) {
    std::function<void_()>::operator()((function<void_()> *)&resetReporter);
  }
  if (((((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
       ((version.field_2._M_local_buf[0xc] & 1U) == 0)) &&
      ((version.field_2._M_local_buf[0xb] & 1U) == 0)) ||
     ((version.field_2._M_local_buf[0xd] & 1U) != 0)) {
LAB_00345d9c:
    if ((version.field_2._M_local_buf[0xd] & 1U) != 0) {
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (bVar3) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &missedValueReporter._M_invoker,(char (*) [5])0xc222b4);
      }
    }
    local_4f0 = cmMakefile::GetPolicyStatus(local_60,CMP0048,false);
    pcVar1 = local_60;
    if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
      if (local_4f0 != OLD) {
        vw.field_2._M_local_buf[10] = '\x01';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ba8,"PROJECT_VERSION",
                   (allocator<char> *)(vw.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b88,"PROJECT_VERSION_MAJOR",
                   (allocator<char> *)(vw.field_2._M_local_buf + 0xe));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b68,"PROJECT_VERSION_MINOR",
                   (allocator<char> *)(vw.field_2._M_local_buf + 0xd));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b48,"PROJECT_VERSION_PATCH",
                   (allocator<char> *)(vw.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b28,"PROJECT_VERSION_TWEAK",
                   (allocator<char> *)(vw.field_2._M_local_buf + 0xb));
        std::operator+(&local_b08,local_90,"_VERSION");
        std::operator+(&local_ae8,local_90,"_VERSION_MAJOR");
        std::operator+(&local_ac8,local_90,"_VERSION_MINOR");
        std::operator+(&local_aa8,local_90,"_VERSION_PATCH");
        std::operator+(&local_a88,local_90,"_VERSION_TWEAK");
        vw.field_2._M_local_buf[10] = '\0';
        local_a68 = &local_ba8;
        local_a60 = 10;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(vw.field_2._M_local_buf + 9));
        __l_00._M_len = local_a60;
        __l_00._M_array = local_a68;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a58,__l_00,
                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(vw.field_2._M_local_buf + 9));
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(vw.field_2._M_local_buf + 9));
        local_11b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a68
        ;
        do {
          local_11b0 = local_11b0 + -1;
          std::__cxx11::string::~string((string *)local_11b0);
        } while (local_11b0 != &local_ba8);
        std::allocator<char>::~allocator((allocator<char> *)(vw.field_2._M_local_buf + 0xb));
        std::allocator<char>::~allocator((allocator<char> *)(vw.field_2._M_local_buf + 0xc));
        std::allocator<char>::~allocator((allocator<char> *)(vw.field_2._M_local_buf + 0xd));
        std::allocator<char>::~allocator((allocator<char> *)(vw.field_2._M_local_buf + 0xe));
        std::allocator<char>::~allocator((allocator<char> *)(vw.field_2._M_local_buf + 0xf));
        bVar3 = cmMakefile::IsRootMakefile(local_60);
        if (bVar3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a58,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a58,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a58,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a58,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a58,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        std::__cxx11::string::string((string *)&__range3);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a58);
        i_3 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a58);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&i_3);
          if (!bVar3) break;
          v_1.Value = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          local_c08 = (string *)cmMakefile::GetDefinition(local_60,v_1.Value);
          local_c00 = local_c08;
          bVar3 = cmNonempty((cmValue)local_c08);
          pcVar1 = local_60;
          name = v_1;
          if (bVar3) {
            if (local_4f0 == WARN) {
              if ((version.field_2._M_local_buf[10] & 1U) == 0) {
                std::__cxx11::string::operator+=((string *)&__range3,"\n  ");
                std::__cxx11::string::operator+=((string *)&__range3,(string *)v_1.Value);
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_c18,"");
              cmMakefile::AddDefinition(pcVar1,name.Value,local_c18);
            }
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        auVar12 = std::__cxx11::string::empty();
        pcVar1 = local_60;
        if ((auVar12 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c88,(cmPolicies *)0x30,auVar12._8_4_);
          cmAlphaNum::cmAlphaNum(&local_c68,&local_c88);
          cmAlphaNum::cmAlphaNum(&local_cb8,"\nThe following variable(s) would be set to empty:");
          cmStrCat<std::__cxx11::string>
                    (&local_c38,&local_c68,&local_cb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3)
          ;
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_c38);
          std::__cxx11::string::~string((string *)&local_c38);
          std::__cxx11::string::~string((string *)&local_c88);
        }
        std::__cxx11::string::~string((string *)&__range3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a58);
      }
LAB_00347510:
      pcVar1 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd8,"PROJECT_DESCRIPTION",&local_cd9);
      local_cf0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(homepage.field_2._M_local_buf + 8));
      cmMakefile::AddDefinition(pcVar1,&local_cd8,local_cf0);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::allocator<char>::~allocator(&local_cd9);
      pcVar1 = local_60;
      std::operator+(&local_d10,local_90,"_DESCRIPTION");
      local_d20 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(homepage.field_2._M_local_buf + 8));
      cmMakefile::AddDefinition(pcVar1,&local_d10,local_d20);
      std::__cxx11::string::~string((string *)&local_d10);
      pcVar1 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d40,"CMAKE_PROJECT_DESCRIPTION",&local_d41);
      TopLevelCMakeVarCondSet(pcVar1,&local_d40,(string *)((long)&homepage.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_d40);
      std::allocator<char>::~allocator(&local_d41);
      pcVar1 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d68,"PROJECT_HOMEPAGE_URL",&local_d69);
      local_d80 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)
                             &languages.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmMakefile::AddDefinition(pcVar1,&local_d68,local_d80);
      std::__cxx11::string::~string((string *)&local_d68);
      std::allocator<char>::~allocator(&local_d69);
      pcVar1 = local_60;
      std::operator+(&local_da0,local_90,"_HOMEPAGE_URL");
      local_db0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)
                             &languages.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmMakefile::AddDefinition(pcVar1,&local_da0,local_db0);
      std::__cxx11::string::~string((string *)&local_da0);
      pcVar1 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dd0,"CMAKE_PROJECT_HOMEPAGE_URL",&local_dd1);
      TopLevelCMakeVarCondSet
                (pcVar1,&local_dd0,
                 (string *)
                 &languages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_dd0);
      std::allocator<char>::~allocator(&local_dd1);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (bVar3) {
        local_e33 = 1;
        local_e30 = &local_e28;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"C",&local_e31);
        local_e30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e08;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_e08,"CXX",&local_e32);
        local_e33 = 0;
        local_de8 = &local_e28;
        local_de0 = 2;
        __l._M_len = 2;
        __l._M_array = local_de8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&missedValueReporter._M_invoker,__l);
        local_1290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_de8
        ;
        do {
          local_1290 = local_1290 + -1;
          std::__cxx11::string::~string((string *)local_1290);
        } while (local_1290 != &local_e28);
        std::allocator<char>::~allocator(&local_e32);
        std::allocator<char>::~allocator(&local_e31);
      }
      cmMakefile::EnableLanguage
                (local_60,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&missedValueReporter._M_invoker,false);
      pcVar2 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e58,"CMAKE_PROJECT_INCLUDE",&local_e59);
      bVar3 = IncludeByVariable(pcVar2,&local_e58);
      std::__cxx11::string::~string((string *)&local_e58);
      std::allocator<char>::~allocator(&local_e59);
      pcVar2 = local_20;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        std::operator+(&local_ea0,"CMAKE_PROJECT_",local_90);
        std::operator+(&local_e80,&local_ea0,"_INCLUDE");
        bVar3 = IncludeByVariable(pcVar2,&local_e80);
        std::__cxx11::string::~string((string *)&local_e80);
        std::__cxx11::string::~string((string *)&local_ea0);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          args_local._7_1_ = 1;
          msg.field_2._8_4_ = 1;
        }
        else {
          args_local._7_1_ = 0;
          msg.field_2._8_4_ = 1;
        }
      }
      else {
        args_local._7_1_ = 0;
        msg.field_2._8_4_ = 1;
      }
    }
    else if ((local_4f0 == OLD) || (local_4f0 == WARN)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"VERSION not allowed unless CMP0048 is set to NEW",
                 (allocator<char> *)&vx.field_0xcf);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)&vx.field_0xcf);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 1;
      msg.field_2._8_4_ = 1;
    }
    else {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&e.field_2 + 8),
                 "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e.field_2 + 8),
                         (string *)((long)&description.field_2 + 8));
      if (bVar3) {
        PVar4 = cmMakefile::GetPolicyStatus(local_60,CMP0096,false);
        std::__cxx11::string::string
                  ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8));
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 *)&maxIntLength);
        if ((PVar4 == OLD) || (PVar4 == WARN)) {
          memset(&i_1,0,0x10);
          uVar8 = std::__cxx11::string::c_str();
          components.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               __isoc99_sscanf(uVar8,"%u.%u.%u.%u",&i_1,&vc,v,v + 1);
          for (components.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              (uint)components.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage < 4;
              components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (uint)components.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
            if ((int)(uint)components.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage <
                components.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
              snprintf(vb[(ulong)(uint)components.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage - 1] + 3,
                       0xb,"%u",(ulong)(&i_1)[(uint)components.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ]);
              std::__cxx11::string::operator+=
                        ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8),
                         " --build ." +
                         (ulong)((uint)components.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) + 9)
              ;
              std::__cxx11::string::operator+=
                        ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8),
                         vb[(ulong)(uint)components.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage - 1] + 3
                        );
              uVar10 = (ulong)(uint)components.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar9 = std::
                       array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                       ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                                     *)&maxIntLength,uVar10);
              std::__cxx11::string::operator=((string *)pvVar9,vb[uVar10 - 1] + 3);
            }
            else {
              vb[(ulong)(uint)components.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - 1][3] = '\0';
            }
          }
        }
        else {
          psVar5 = (string *)(version_components._M_elems[3].field_2._M_local_buf + 8);
          std::__cxx11::string::operator=
                    ((string *)psVar5,(string *)(description.field_2._M_local_buf + 8));
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_748,psVar5,'.',false);
          vv.field_2._12_4_ = 0;
          while( true ) {
            uVar10 = (ulong)(uint)vv.field_2._12_4_;
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_748);
            if (sVar6 <= uVar10) break;
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_748,(ulong)(uint)vv.field_2._12_4_);
            pvVar9 = std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                     ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                                   *)&maxIntLength,(ulong)(uint)vv.field_2._12_4_);
            std::__cxx11::string::operator=((string *)pvVar9,(string *)pvVar11);
            vv.field_2._12_4_ = vv.field_2._12_4_ + 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_748);
        }
        std::__cxx11::string::string((string *)local_770);
        std::operator+(&local_790,local_90,"_VERSION");
        std::__cxx11::string::operator=((string *)local_770,(string *)&local_790);
        std::__cxx11::string::~string((string *)&local_790);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,"PROJECT_VERSION",&local_7b1);
        local_7c8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8));
        cmMakefile::AddDefinition(pcVar1,&local_7b0,local_7c8);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::allocator<char>::~allocator(&local_7b1);
        pcVar1 = local_60;
        local_7d8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8));
        cmMakefile::AddDefinition(pcVar1,(string *)local_770,local_7d8);
        std::operator+(&local_7f8,local_90,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)local_770,(string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_7f8);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_818,"PROJECT_VERSION_MAJOR",&local_819);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,0);
        local_830 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,&local_818,local_830);
        std::__cxx11::string::~string((string *)&local_818);
        std::allocator<char>::~allocator(&local_819);
        pcVar1 = local_60;
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,0);
        local_840 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,(string *)local_770,local_840);
        std::operator+(&local_860,local_90,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)local_770,(string *)&local_860);
        std::__cxx11::string::~string((string *)&local_860);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_880,"PROJECT_VERSION_MINOR",&local_881);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,1);
        local_898 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,&local_880,local_898);
        std::__cxx11::string::~string((string *)&local_880);
        std::allocator<char>::~allocator(&local_881);
        pcVar1 = local_60;
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,1);
        local_8a8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,(string *)local_770,local_8a8);
        std::operator+(&local_8c8,local_90,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)local_770,(string *)&local_8c8);
        std::__cxx11::string::~string((string *)&local_8c8);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e8,"PROJECT_VERSION_PATCH",&local_8e9);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,2);
        local_900 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,&local_8e8,local_900);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator(&local_8e9);
        pcVar1 = local_60;
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,2);
        local_910 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,(string *)local_770,local_910);
        std::operator+(&local_930,local_90,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)local_770,(string *)&local_930);
        std::__cxx11::string::~string((string *)&local_930);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"PROJECT_VERSION_TWEAK",&local_951);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,3);
        local_968 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,&local_950,local_968);
        std::__cxx11::string::~string((string *)&local_950);
        std::allocator<char>::~allocator(&local_951);
        pcVar1 = local_60;
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,3);
        local_978 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar9);
        cmMakefile::AddDefinition(pcVar1,(string *)local_770,local_978);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_998,"CMAKE_PROJECT_VERSION",&local_999);
        TopLevelCMakeVarCondSet
                  (pcVar1,&local_998,(string *)((long)&version_components._M_elems[3].field_2 + 8));
        std::__cxx11::string::~string((string *)&local_998);
        std::allocator<char>::~allocator(&local_999);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9c0,"CMAKE_PROJECT_VERSION_MAJOR",&local_9c1);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,0);
        TopLevelCMakeVarCondSet(pcVar1,&local_9c0,pvVar9);
        std::__cxx11::string::~string((string *)&local_9c0);
        std::allocator<char>::~allocator(&local_9c1);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9e8,"CMAKE_PROJECT_VERSION_MINOR",&local_9e9);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,1);
        TopLevelCMakeVarCondSet(pcVar1,&local_9e8,pvVar9);
        std::__cxx11::string::~string((string *)&local_9e8);
        std::allocator<char>::~allocator(&local_9e9);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CMAKE_PROJECT_VERSION_PATCH",&local_a11);
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,2);
        TopLevelCMakeVarCondSet(pcVar1,&local_a10,pvVar9);
        std::__cxx11::string::~string((string *)&local_a10);
        std::allocator<char>::~allocator(&local_a11);
        pcVar1 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a38,"CMAKE_PROJECT_VERSION_TWEAK",
                   (allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pvVar9 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                               *)&maxIntLength,3);
        TopLevelCMakeVarCondSet(pcVar1,&local_a38,pvVar9);
        std::__cxx11::string::~string((string *)&local_a38);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)local_770);
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)&maxIntLength);
        std::__cxx11::string::~string
                  ((string *)(version_components._M_elems[3].field_2._M_local_buf + 8));
        msg.field_2._8_4_ = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_628,"VERSION \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&description.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_608,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_628,"\" format invalid.");
        std::__cxx11::string::~string((string *)local_628);
        cmMakefile::IssueMessage(local_60,FATAL_ERROR,(string *)local_608);
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_608);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
      if (msg.field_2._8_4_ == 0) goto LAB_00347510;
    }
  }
  else {
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&missedValueReporter._M_invoker);
    pcVar1 = local_60;
    if (bVar3) goto LAB_00345d9c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmp0048,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,&local_4e9);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&cmp0048);
    std::__cxx11::string::~string((string *)&cmp0048);
    std::allocator<char>::~allocator(&local_4e9);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 1;
    msg.field_2._8_4_ = 1;
  }
LAB_00347cf7:
  std::function<void_()>::~function((function<void_()> *)&resetReporter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&missedValueReporter._M_invoker);
  std::__cxx11::string::~string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
LAB_00347d73:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmProjectCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE_BEFORE")) {
    return false;
  }

  mf.SetProjectName(projectName);

  mf.AddCacheDefinition(projectName + "_BINARY_DIR",
                        mf.GetCurrentBinaryDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);
  mf.AddCacheDefinition(projectName + "_SOURCE_DIR",
                        mf.GetCurrentSourceDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);

  mf.AddDefinition("PROJECT_BINARY_DIR", mf.GetCurrentBinaryDirectory());
  mf.AddDefinition("PROJECT_SOURCE_DIR", mf.GetCurrentSourceDirectory());

  mf.AddDefinition("PROJECT_NAME", projectName);

  mf.AddDefinitionBool("PROJECT_IS_TOP_LEVEL", mf.IsRootMakefile());
  mf.AddCacheDefinition(projectName + "_IS_TOP_LEVEL",
                        mf.IsRootMakefile() ? "ON" : "OFF",
                        "Value Computed by CMake", cmStateEnums::STATIC);

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!mf.GetDefinition("CMAKE_PROJECT_NAME") || mf.IsRootMakefile()) {
    mf.RemoveDefinition("CMAKE_PROJECT_NAME");
    mf.AddCacheDefinition("CMAKE_PROJECT_NAME", projectName,
                          "Value Computed by CMake", cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg = cmStrCat(
          "the following parameters must be specified after LANGUAGES "
          "keyword: ",
          cmJoin(languages, ", "), '.');
        mf.IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
                    "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus const cmp0048 =
    mf.GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      mf.IssueMessage(MessageType::FATAL_ERROR,
                      "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = R"(VERSION ")" + version + R"(" format invalid.)";
      mf.IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmPolicies::PolicyStatus const cmp0096 =
      mf.GetPolicyStatus(cmPolicies::CMP0096);

    constexpr std::size_t MAX_VERSION_COMPONENTS = 4u;
    std::string version_string;
    std::array<std::string, MAX_VERSION_COMPONENTS> version_components;

    if (cmp0096 == cmPolicies::OLD || cmp0096 == cmPolicies::WARN) {
      constexpr size_t maxIntLength =
        std::numeric_limits<unsigned>::digits10 + 2;
      char vb[MAX_VERSION_COMPONENTS][maxIntLength];
      unsigned v[MAX_VERSION_COMPONENTS] = { 0, 0, 0, 0 };
      const int vc = std::sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1],
                                 &v[2], &v[3]);
      for (auto i = 0u; i < MAX_VERSION_COMPONENTS; ++i) {
        if (static_cast<int>(i) < vc) {
          std::snprintf(vb[i], maxIntLength, "%u", v[i]);
          version_string += &"."[static_cast<std::size_t>(i == 0)];
          version_string += vb[i];
          version_components[i] = vb[i];
        } else {
          vb[i][0] = '\x00';
        }
      }
    } else {
      // The regex above verified that we have a .-separated string of
      // non-negative integer components.  Keep the original string.
      version_string = std::move(version);
      // Split the integer components.
      auto components = cmSystemTools::SplitString(version_string, '.');
      for (auto i = 0u; i < components.size(); ++i) {
        version_components[i] = std::move(components[i]);
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    mf.AddDefinition("PROJECT_VERSION", version_string);
    mf.AddDefinition(vv, version_string);
    vv = projectName + "_VERSION_MAJOR";
    mf.AddDefinition("PROJECT_VERSION_MAJOR", version_components[0]);
    mf.AddDefinition(vv, version_components[0]);
    vv = projectName + "_VERSION_MINOR";
    mf.AddDefinition("PROJECT_VERSION_MINOR", version_components[1]);
    mf.AddDefinition(vv, version_components[1]);
    vv = projectName + "_VERSION_PATCH";
    mf.AddDefinition("PROJECT_VERSION_PATCH", version_components[2]);
    mf.AddDefinition(vv, version_components[2]);
    vv = projectName + "_VERSION_TWEAK";
    mf.AddDefinition("PROJECT_VERSION_TWEAK", version_components[3]);
    mf.AddDefinition(vv, version_components[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION", version_string);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MAJOR",
                            version_components[0]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MINOR",
                            version_components[1]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_PATCH",
                            version_components[2]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_TWEAK",
                            version_components[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv = { "PROJECT_VERSION",
                                    "PROJECT_VERSION_MAJOR",
                                    "PROJECT_VERSION_MINOR",
                                    "PROJECT_VERSION_PATCH",
                                    "PROJECT_VERSION_TWEAK",
                                    projectName + "_VERSION",
                                    projectName + "_VERSION_MAJOR",
                                    projectName + "_VERSION_MINOR",
                                    projectName + "_VERSION_PATCH",
                                    projectName + "_VERSION_TWEAK" };
    if (mf.IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      cmValue v = mf.GetDefinition(i);
      if (cmNonempty(v)) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          mf.AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0048),
                 "\nThe following variable(s) would be set to empty:", vw));
    }
  }

  mf.AddDefinition("PROJECT_DESCRIPTION", description);
  mf.AddDefinition(projectName + "_DESCRIPTION", description);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_DESCRIPTION", description);

  mf.AddDefinition("PROJECT_HOMEPAGE_URL", homepage);
  mf.AddDefinition(projectName + "_HOMEPAGE_URL", homepage);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_HOMEPAGE_URL", homepage);

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages = { "C", "CXX" };
  }
  mf.EnableLanguage(languages, false);

  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}